

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cookmem_02.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  Pool *pPVar1;
  void *pvVar2;
  size_type sVar3;
  ostream *poVar4;
  undefined4 *puVar5;
  int iVar6;
  size_type userSize;
  MallocArena local_2a0;
  NoActionMemLogger local_298 [8];
  MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void> local_290;
  
  local_2a0.m_minSize = 0x10000;
  pPVar1 = &local_290.m_pool;
  local_290.m_arena = &local_2a0;
  local_290.m_logger = local_298;
  local_290.m_pool.m_arena = &local_2a0;
  local_290.m_pool.m_logger = local_298;
  memset(&local_290.m_pool.m_footprintLimit,0,0x232);
  local_290.m_pool.m_paddingByte = -0x33;
  local_290._vptr_MemContext = (_func_int **)&PTR__SimpleMemContext_00105d20;
  pvVar2 = cookmem::MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::allocate
                     (pPVar1,0x1e);
  if (pvVar2 == (void *)0x0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"Mismatch at line ");
    iVar6 = 0x23;
  }
  else {
    sVar3 = cookmem::MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::getUserSize
                      (pPVar1,pvVar2);
    if (sVar3 == 0x20) {
      cookmem::MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::deallocate
                (pPVar1,pvVar2,0);
      sVar3 = cookmem::MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::getUserSize
                        (pPVar1,pvVar2);
      if (sVar3 == 0) {
        pvVar2 = cookmem::MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::allocate
                           (pPVar1,300);
        if (pvVar2 == (void *)0x0) {
          poVar4 = std::operator<<((ostream *)&std::cout,"Mismatch at line ");
          iVar6 = 0x29;
        }
        else {
          sVar3 = cookmem::MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::
                  getUserSize(pPVar1,pvVar2);
          if (sVar3 == 0x130) {
            pvVar2 = cookmem::MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::
                     allocate(pPVar1,3000);
            if (pvVar2 == (void *)0x0) {
              poVar4 = std::operator<<((ostream *)&std::cout,"Mismatch at line ");
              iVar6 = 0x2c;
            }
            else {
              sVar3 = cookmem::MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::
                      getUserSize(pPVar1,pvVar2);
              if (sVar3 == 0xbc0) {
                pvVar2 = cookmem::MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::
                         allocate(pPVar1,30000);
                if (pvVar2 == (void *)0x0) {
                  poVar4 = std::operator<<((ostream *)&std::cout,"Mismatch at line ");
                  iVar6 = 0x2f;
                }
                else {
                  sVar3 = cookmem::MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::
                          getUserSize(pPVar1,pvVar2);
                  if (sVar3 == 30000) {
                    pvVar2 = cookmem::
                             MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::
                             allocate(pPVar1,30000);
                    sVar3 = cookmem::MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>
                            ::getUserSize(pPVar1,pvVar2);
                    if (sVar3 == 30000) {
                      if (pvVar2 == (void *)0x0) {
                        poVar4 = std::operator<<((ostream *)&std::cout,"Mismatch at line ");
                        iVar6 = 0x33;
                      }
                      else {
                        pvVar2 = cookmem::
                                 MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::
                                 allocate(pPVar1,30000);
                        sVar3 = cookmem::
                                MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::
                                getUserSize(pPVar1,pvVar2);
                        if (sVar3 == 30000) {
                          if (pvVar2 != (void *)0x0) {
                            cookmem::
                            MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::
                            ~MemContext(&local_290);
                            local_2a0.m_minSize = 0x10000;
                            pPVar1 = &local_290.m_pool;
                            local_290.m_arena = &local_2a0;
                            local_290.m_logger = local_298;
                            local_290.m_pool.m_arena = &local_2a0;
                            local_290.m_pool.m_logger = local_298;
                            memset(&local_290.m_pool.m_footprintLimit,0,0x232);
                            local_290.m_pool.m_paddingByte = -0x33;
                            local_290._vptr_MemContext =
                                 (_func_int **)&PTR__SimpleMemContext_00105d20;
                            local_290.m_pool.m_storingExactSize = true;
                            puVar5 = (undefined4 *)
                                     cookmem::
                                     MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>
                                     ::allocate(pPVar1,0x1e);
                            if (puVar5 == (undefined4 *)0x0) {
                              poVar4 = std::operator<<((ostream *)&std::cout,"Mismatch at line ");
                              iVar6 = 0x47;
                            }
                            else {
                              *(undefined4 *)((long)puVar5 + 0xe) = 0xffffffff;
                              *(undefined4 *)((long)puVar5 + 0x12) = 0xffffffff;
                              *(undefined4 *)((long)puVar5 + 0x16) = 0xffffffff;
                              *(undefined4 *)((long)puVar5 + 0x1a) = 0xffffffff;
                              *puVar5 = 0xffffffff;
                              puVar5[1] = 0xffffffff;
                              puVar5[2] = 0xffffffff;
                              puVar5[3] = 0xffffffff;
                              sVar3 = cookmem::
                                      MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>
                                      ::getUserSize(pPVar1,puVar5);
                              if (sVar3 == 0x1e) {
                                cookmem::
                                MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::
                                deallocate(pPVar1,puVar5,0);
                                pvVar2 = cookmem::
                                         MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>
                                         ::allocate(pPVar1,300);
                                if (pvVar2 == (void *)0x0) {
                                  poVar4 = std::operator<<((ostream *)&std::cout,"Mismatch at line "
                                                          );
                                  iVar6 = 0x4d;
                                }
                                else {
                                  memset(pvVar2,0xff,300);
                                  sVar3 = cookmem::
                                          MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>
                                          ::getUserSize(pPVar1,pvVar2);
                                  if (sVar3 == 300) {
                                    pvVar2 = cookmem::
                                             MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>
                                             ::allocate(pPVar1,3000);
                                    if (pvVar2 == (void *)0x0) {
                                      poVar4 = std::operator<<((ostream *)&std::cout,
                                                               "Mismatch at line ");
                                      iVar6 = 0x52;
                                    }
                                    else {
                                      memset(pvVar2,0xff,3000);
                                      sVar3 = cookmem::
                                              MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>
                                              ::getUserSize(pPVar1,pvVar2);
                                      if (sVar3 == 3000) {
                                        pvVar2 = cookmem::
                                                 MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>
                                                 ::allocate(pPVar1,30000);
                                        if (pvVar2 == (void *)0x0) {
                                          poVar4 = std::operator<<((ostream *)&std::cout,
                                                                   "Mismatch at line ");
                                          iVar6 = 0x57;
                                        }
                                        else {
                                          memset(pvVar2,0xff,3000);
                                          sVar3 = cookmem::
                                                  MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>
                                                  ::getUserSize(pPVar1,pvVar2);
                                          if (sVar3 == 30000) {
                                            pvVar2 = cookmem::
                                                  MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>
                                                  ::allocate(pPVar1,30000);
                                            sVar3 = cookmem::
                                                  MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>
                                                  ::getUserSize(pPVar1,pvVar2);
                                            if (sVar3 == 30000) {
                                              memset(pvVar2,0xff,30000);
                                              pvVar2 = cookmem::
                                                  MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>
                                                  ::allocate(pPVar1,30000);
                                              sVar3 = cookmem::
                                                  MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>
                                                  ::getUserSize(pPVar1,pvVar2);
                                              if (sVar3 == 30000) {
                                                memset(pvVar2,0xff,30000);
                                                cookmem::
                                                MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>
                                                ::~MemContext(&local_290);
                                                local_2a0.m_minSize = 0x10000;
                                                pPVar1 = &local_290.m_pool;
                                                local_290.m_arena = &local_2a0;
                                                local_290.m_logger = local_298;
                                                local_290.m_pool.m_arena = &local_2a0;
                                                local_290.m_pool.m_logger = local_298;
                                                memset(&local_290.m_pool.m_footprintLimit,0,0x230);
                                                local_290.m_pool.m_storingExactSize = true;
                                                local_290.m_pool.m_padding = true;
                                                local_290.m_pool.m_paddingByte = -0x33;
                                                local_290._vptr_MemContext =
                                                     (_func_int **)&PTR__SimpleMemContext_00105d20;
                                                puVar5 = (undefined4 *)
                                                         cookmem::
                                                  MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>
                                                  ::allocate(pPVar1,0x1e);
                                                if (puVar5 == (undefined4 *)0x0) {
                                                  poVar4 = std::operator<<((ostream *)&std::cout,
                                                                           "Mismatch at line ");
                                                  iVar6 = 0x73;
                                                }
                                                else {
                                                  *(undefined4 *)((long)puVar5 + 0xe) = 0xffffffff;
                                                  *(undefined4 *)((long)puVar5 + 0x12) = 0xffffffff;
                                                  *(undefined4 *)((long)puVar5 + 0x16) = 0xffffffff;
                                                  *(undefined4 *)((long)puVar5 + 0x1a) = 0xffffffff;
                                                  *puVar5 = 0xffffffff;
                                                  puVar5[1] = 0xffffffff;
                                                  puVar5[2] = 0xffffffff;
                                                  puVar5[3] = 0xffffffff;
                                                  sVar3 = cookmem::
                                                  MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>
                                                  ::getUserSize(pPVar1,puVar5);
                                                  if (sVar3 == 0x1e) {
                                                    cookmem::
                                                  MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>
                                                  ::deallocate(pPVar1,puVar5,0);
                                                  pvVar2 = cookmem::
                                                  MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>
                                                  ::allocate(pPVar1,300);
                                                  if (pvVar2 == (void *)0x0) {
                                                    poVar4 = std::operator<<((ostream *)&std::cout,
                                                                             "Mismatch at line ");
                                                    iVar6 = 0x79;
                                                  }
                                                  else {
                                                    memset(pvVar2,0xff,300);
                                                    sVar3 = cookmem::
                                                  MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>
                                                  ::getUserSize(pPVar1,pvVar2);
                                                  if (sVar3 == 300) {
                                                    pvVar2 = cookmem::
                                                  MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>
                                                  ::allocate(pPVar1,3000);
                                                  if (pvVar2 == (void *)0x0) {
                                                    poVar4 = std::operator<<((ostream *)&std::cout,
                                                                             "Mismatch at line ");
                                                    iVar6 = 0x7e;
                                                  }
                                                  else {
                                                    memset(pvVar2,0xff,3000);
                                                    sVar3 = cookmem::
                                                  MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>
                                                  ::getUserSize(pPVar1,pvVar2);
                                                  if (sVar3 == 3000) {
                                                    cookmem::
                                                  MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>
                                                  ::deallocate(pPVar1,pvVar2,0);
                                                  userSize = 30000;
                                                  while( true ) {
                                                    if (userSize == 0x7544) {
                                                      cookmem::
                                                  MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>
                                                  ::~MemContext(&local_290);
                                                  return 0;
                                                  }
                                                  pvVar2 = cookmem::
                                                  MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>
                                                  ::allocate(pPVar1,userSize);
                                                  if (pvVar2 == (void *)0x0) break;
                                                  memset(pvVar2,0xff,userSize);
                                                  sVar3 = cookmem::
                                                  MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>
                                                  ::getUserSize(pPVar1,pvVar2);
                                                  if (userSize != sVar3) {
                                                    poVar4 = std::operator<<((ostream *)&std::cout,
                                                                             "Mismatch at line ");
                                                    iVar6 = 0x88;
                                                    goto LAB_00102aca;
                                                  }
                                                  cookmem::
                                                  MemPool<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>
                                                  ::deallocate(pPVar1,pvVar2,0);
                                                  userSize = userSize + 1;
                                                  }
                                                  poVar4 = std::operator<<((ostream *)&std::cout,
                                                                           "Mismatch at line ");
                                                  iVar6 = 0x86;
LAB_00102aca:
                                                  poVar4 = (ostream *)
                                                           std::ostream::operator<<(poVar4,iVar6);
                                                  std::endl<char,std::char_traits<char>>(poVar4);
                                                  cookmem::
                                                  MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>
                                                  ::~MemContext(&local_290);
                                                  iVar6 = 0x94;
                                                  if (userSize == 0x7544) {
                                                    return 0;
                                                  }
                                                  goto LAB_00102330;
                                                  }
                                                  poVar4 = std::operator<<((ostream *)&std::cout,
                                                                           "Mismatch at line ");
                                                  iVar6 = 0x80;
                                                  }
                                                  }
                                                  else {
                                                    poVar4 = std::operator<<((ostream *)&std::cout,
                                                                             "Mismatch at line ");
                                                    iVar6 = 0x7b;
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    poVar4 = std::operator<<((ostream *)&std::cout,
                                                                             "Mismatch at line ");
                                                    iVar6 = 0x75;
                                                  }
                                                }
                                                poVar4 = (ostream *)
                                                         std::ostream::operator<<(poVar4,iVar6);
                                                std::endl<char,std::char_traits<char>>(poVar4);
                                                cookmem::
                                                MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>
                                                ::~MemContext(&local_290);
                                                iVar6 = 0x94;
                                                goto LAB_00102330;
                                              }
                                              poVar4 = std::operator<<((ostream *)&std::cout,
                                                                       "Mismatch at line ");
                                              iVar6 = 0x61;
                                            }
                                            else {
                                              poVar4 = std::operator<<((ostream *)&std::cout,
                                                                       "Mismatch at line ");
                                              iVar6 = 0x5c;
                                            }
                                          }
                                          else {
                                            poVar4 = std::operator<<((ostream *)&std::cout,
                                                                     "Mismatch at line ");
                                            iVar6 = 0x59;
                                          }
                                        }
                                      }
                                      else {
                                        poVar4 = std::operator<<((ostream *)&std::cout,
                                                                 "Mismatch at line ");
                                        iVar6 = 0x54;
                                      }
                                    }
                                  }
                                  else {
                                    poVar4 = std::operator<<((ostream *)&std::cout,
                                                             "Mismatch at line ");
                                    iVar6 = 0x4f;
                                  }
                                }
                              }
                              else {
                                poVar4 = std::operator<<((ostream *)&std::cout,"Mismatch at line ");
                                iVar6 = 0x49;
                              }
                            }
                            poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar6);
                            std::endl<char,std::char_traits<char>>(poVar4);
                            cookmem::
                            MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::
                            ~MemContext(&local_290);
                            iVar6 = 0x93;
                            goto LAB_00102330;
                          }
                          poVar4 = std::operator<<((ostream *)&std::cout,"Mismatch at line ");
                          iVar6 = 0x36;
                        }
                        else {
                          poVar4 = std::operator<<((ostream *)&std::cout,"Mismatch at line ");
                          iVar6 = 0x35;
                        }
                      }
                    }
                    else {
                      poVar4 = std::operator<<((ostream *)&std::cout,"Mismatch at line ");
                      iVar6 = 0x32;
                    }
                  }
                  else {
                    poVar4 = std::operator<<((ostream *)&std::cout,"Mismatch at line ");
                    iVar6 = 0x30;
                  }
                }
              }
              else {
                poVar4 = std::operator<<((ostream *)&std::cout,"Mismatch at line ");
                iVar6 = 0x2d;
              }
            }
          }
          else {
            poVar4 = std::operator<<((ostream *)&std::cout,"Mismatch at line ");
            iVar6 = 0x2a;
          }
        }
      }
      else {
        poVar4 = std::operator<<((ostream *)&std::cout,"Mismatch at line ");
        iVar6 = 0x26;
      }
    }
    else {
      poVar4 = std::operator<<((ostream *)&std::cout,"Mismatch at line ");
      iVar6 = 0x24;
    }
  }
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar6);
  std::endl<char,std::char_traits<char>>(poVar4);
  cookmem::MemContext<cookmem::MallocArena,_cookmem::NoActionMemLogger,_void>::~MemContext
            (&local_290);
  iVar6 = 0x92;
LAB_00102330:
  poVar4 = std::operator<<((ostream *)&std::cout,"Mismatch at line ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar6);
  std::endl<char,std::char_traits<char>>(poVar4);
  return 1;
}

Assistant:

int
main (int argc, const char* argv[])
{
    ASSERT_EQ (0, test1 ());
    ASSERT_EQ (0, test2 ());
    ASSERT_EQ (0, test3 ());
    return 0;
}